

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O1

void emit_call_(ASMState *as,MCode *target)

{
  MCode *pMVar1;
  int iVar2;
  
  pMVar1 = as->mcp;
  iVar2 = (int)((long)target - (long)pMVar1);
  if ((long)iVar2 == (long)target - (long)pMVar1) {
    *(int *)(pMVar1 + -4) = iVar2;
    pMVar1[-5] = 0xe8;
    as->mcp = pMVar1 + -5;
    return;
  }
  pMVar1[-2] = 0xff;
  pMVar1[-1] = 0xd0;
  as->mcp = pMVar1 + -2;
  emit_loadu64(as,0,(uint64_t)target);
  return;
}

Assistant:

static void emit_call_(ASMState *as, MCode *target)
{
  MCode *p = as->mcp;
#if LJ_64
  if (target-p != (int32_t)(target-p)) {
    /* Assumes RID_RET is never an argument to calls and always clobbered. */
    emit_rr(as, XO_GROUP5, XOg_CALL, RID_RET);
    emit_loadu64(as, RID_RET, (uint64_t)target);
    return;
  }
#endif
  *(int32_t *)(p-4) = jmprel(p, target);
  p[-5] = XI_CALL;
  as->mcp = p - 5;
}